

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

AnalogConsumer_python * __thiscall
PythonModuleClient::subanalogdata_python(PythonModuleClient *this,size_t buffersize,list *l)

{
  SubType SVar1;
  network_pimpl *this_00;
  AnalogConsumer_python *this_01;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  allocator local_3e2;
  allocator local_3e1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e0;
  string local_3c8;
  HFParsingInfo local_3a8;
  HFParsingInfo local_368;
  HFSubSockSettings local_328;
  HighFreqDataType local_280;
  HighFreqDataType local_1f0;
  HighFreqDataType local_160;
  HFSubSockSettings local_d0;
  
  this_00 = (this->super_AbstractModuleClient).super_MlmWrap.state;
  std::__cxx11::string::string((string *)&local_328,"analogstream",&local_3e1);
  std::__cxx11::string::string((string *)&local_3a8,"Trodes",&local_3e2);
  network_pimpl::find_hfdt(&local_280,this_00,(string *)&local_328,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_328);
  listToVec<std::__cxx11::string>(&local_3e0,l);
  HighFreqDataType::getDataFormat_abi_cxx11_(&local_3c8,&local_280);
  MlmWrap::createAnalogParsingInfo(&local_3a8,(MlmWrap *)this,&local_3e0,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e0);
  this_01 = (AnalogConsumer_python *)operator_new(0x480);
  HighFreqDataType::HighFreqDataType(&local_160,&local_280);
  HFParsingInfo::HFParsingInfo(&local_368,&local_3a8);
  AnalogConsumer_python::AnalogConsumer_python(this_01,&local_160,(int)buffersize,&local_368);
  HFParsingInfo::~HFParsingInfo(&local_368);
  HighFreqDataType::~HighFreqDataType(&local_160);
  HighFreqDataType::HighFreqDataType(&local_1f0,&local_280);
  SVar1 = (this_01->super_AnalogConsumer).super_HFSubConsumer.super_HighFreqSub.sockType;
  HighFreqDataType::HighFreqDataType(&local_328.dataType,&local_1f0);
  local_328.userFoo = (hfs_data_callback_fn)0x0;
  local_328.args = (void *)0x0;
  local_328.subSockType = SVar1;
  HighFreqDataType::~HighFreqDataType(&local_1f0);
  MlmWrap::addSubToList((MlmWrap *)this,(HighFreqSub *)this_01);
  HFSubSockSettings::HFSubSockSettings(&local_d0,&local_328);
  MlmWrap::addHfTypeToSubbedList((MlmWrap *)this,&local_d0);
  HighFreqDataType::~HighFreqDataType(&local_d0.dataType);
  HighFreqDataType::~HighFreqDataType(&local_328.dataType);
  HFParsingInfo::~HFParsingInfo(&local_3a8);
  HighFreqDataType::~HighFreqDataType(&local_280);
  return this_01;
}

Assistant:

AnalogConsumer_python* subanalogdata_python(size_t buffersize, list& l){
        HighFreqDataType dt = state->find_hfdt(hfType_ANALOG, TRODES_NETWORK_ID);
        HFParsingInfo parseinfo = createAnalogParsingInfo(listToVec<std::string>(l), dt.getDataFormat());
        AnalogConsumer_python* newsub = new AnalogConsumer_python(dt, buffersize, parseinfo);
        HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
        addSubToList(newsub);
        addHfTypeToSubbedList(sockinfo);
        return newsub;
    }